

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_nbcd_8_pd7(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint addr_in;
  uint value;
  
  addr_in = m68ki_cpu.dar[0xf] - 2;
  m68ki_cpu.dar[0xf] = addr_in;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar1 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(addr_in);
  }
  uVar2 = m68k_read_memory_8(uVar1 & m68ki_cpu.address_mask);
  iVar4 = ((int)(m68ki_cpu.x_flag << 0x17) >> 0x1f) - uVar2;
  value = 0x9a;
  uVar2 = iVar4 + 0x9a;
  uVar3 = uVar2 & 0xff;
  if (uVar3 == 0x9a) {
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
  }
  else {
    value = iVar4 + 0xaaU & 0xf0;
    if ((uVar2 & 0xf) != 10) {
      value = uVar3;
    }
    m68ki_cpu.v_flag = ~uVar3 & value;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,value);
    m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | value;
    m68ki_cpu.c_flag = 0x100;
  }
  m68ki_cpu.x_flag = m68ki_cpu.c_flag;
  m68ki_cpu.n_flag = value;
  return;
}

Assistant:

static void m68k_op_nbcd_8_pd7(void)
{
	uint ea = EA_A7_PD_8();
	uint dst = m68ki_read_8(ea);
	uint res = MASK_OUT_ABOVE_8(0x9a - dst - XFLAG_AS_1());

	if(res != 0x9a)
	{
		FLAG_V = ~res; /* Undefined V behavior */

		if((res & 0x0f) == 0xa)
			res = (res & 0xf0) + 0x10;

		res = MASK_OUT_ABOVE_8(res);

		FLAG_V &= res; /* Undefined V behavior part II */

		m68ki_write_8(ea, MASK_OUT_ABOVE_8(res));

		FLAG_Z |= res;
		FLAG_C = CFLAG_SET;
		FLAG_X = XFLAG_SET;
	}
	else
	{
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;
		FLAG_X = XFLAG_CLEAR;
	}
	FLAG_N = NFLAG_8(res);	/* Undefined N behavior */
}